

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O2

uint8_t u_getCombiningClass_63(UChar32 c)

{
  uint8_t uVar1;
  uint in_EAX;
  int iVar2;
  Normalizer2 *pNVar3;
  UErrorCode errorCode;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  pNVar3 = icu_63::Normalizer2::getNFDInstance((UErrorCode *)((long)&uStack_18 + 4));
  if (uStack_18._4_4_ < 1) {
    iVar2 = (*(pNVar3->super_UObject)._vptr_UObject[10])(pNVar3,c);
    uVar1 = (uint8_t)iVar2;
  }
  else {
    uVar1 = '\0';
  }
  return uVar1;
}

Assistant:

U_CAPI uint8_t U_EXPORT2
u_getCombiningClass(UChar32 c) {
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2 *nfd=Normalizer2::getNFDInstance(errorCode);
    if(U_SUCCESS(errorCode)) {
        return nfd->getCombiningClass(c);
    } else {
        return 0;
    }
}